

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O1

void copytypeinfo(rnntypeinfo *dst,rnntypeinfo *src,char *file)

{
  int iVar1;
  char *pcVar2;
  rnnvalue **pprVar3;
  rnnvalue *prVar4;
  rnnbitfield **pprVar5;
  rnnbitfield *prVar6;
  int iVar7;
  long lVar8;
  
  pcVar2 = src->name;
  dst->name = pcVar2;
  if (pcVar2 != (char *)0x0) {
    pcVar2 = strdup(pcVar2);
    dst->name = pcVar2;
  }
  dst->shr = src->shr;
  dst->add = src->add;
  dst->min = src->min;
  dst->max = src->max;
  dst->align = src->align;
  if (0 < src->valsnum) {
    lVar8 = 0;
    do {
      iVar1 = dst->valsmax;
      if (iVar1 <= dst->valsnum) {
        iVar7 = iVar1 * 2;
        if (iVar1 == 0) {
          iVar7 = 0x10;
        }
        dst->valsmax = iVar7;
        pprVar3 = (rnnvalue **)realloc(dst->vals,(long)iVar7 << 3);
        dst->vals = pprVar3;
      }
      prVar4 = copyvalue(src->vals[lVar8],file);
      iVar1 = dst->valsnum;
      dst->valsnum = iVar1 + 1;
      dst->vals[iVar1] = prVar4;
      lVar8 = lVar8 + 1;
    } while (lVar8 < src->valsnum);
  }
  if (0 < src->bitfieldsnum) {
    lVar8 = 0;
    do {
      iVar1 = dst->bitfieldsmax;
      if (iVar1 <= dst->bitfieldsnum) {
        iVar7 = iVar1 * 2;
        if (iVar1 == 0) {
          iVar7 = 0x10;
        }
        dst->bitfieldsmax = iVar7;
        pprVar5 = (rnnbitfield **)realloc(dst->bitfields,(long)iVar7 << 3);
        dst->bitfields = pprVar5;
      }
      prVar6 = copybitfield(src->bitfields[lVar8],file);
      iVar1 = dst->bitfieldsnum;
      dst->bitfieldsnum = iVar1 + 1;
      dst->bitfields[iVar1] = prVar6;
      lVar8 = lVar8 + 1;
    } while (lVar8 < src->bitfieldsnum);
  }
  return;
}

Assistant:

static void copytypeinfo (struct rnntypeinfo *dst, struct rnntypeinfo *src, char *file) {
	int i;
	dst->name = src->name;
	if (dst->name)
		dst->name = strdup(dst->name);
	dst->shr = src->shr;
	dst->add = src->add;
	dst->min = src->min;
	dst->max = src->max;
	dst->align = src->align;
	for (i = 0; i < src->valsnum; i++)
		ADDARRAY(dst->vals, copyvalue(src->vals[i], file));
	for (i = 0; i < src->bitfieldsnum; i++)
		ADDARRAY(dst->bitfields, copybitfield(src->bitfields[i], file));
}